

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  ushort uVar5;
  undefined8 uVar6;
  ushort uVar7;
  BYTE *s;
  ushort *puVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ushort *puVar12;
  long lVar13;
  byte *pbVar14;
  ushort *puVar15;
  uint uVar16;
  ulong uVar17;
  BYTE *d;
  byte *pbVar18;
  BYTE *s_1;
  ushort *puVar19;
  ushort *puVar20;
  ulong uVar21;
  BYTE *e;
  byte *__dest;
  int local_38;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  iVar11 = -1;
  if (src != (char *)0x0) {
    if (dstCapacity == 0) {
      iVar11 = 0;
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(src + compressedSize);
      pbVar2 = (byte *)(dst + dstCapacity);
      puVar8 = (ushort *)src;
      __dest = (byte *)dst;
      if (dstCapacity < 0x40) goto LAB_0010a5aa;
LAB_0010a027:
      while( true ) {
        puVar20 = (ushort *)((long)puVar8 + 1);
        bVar4 = (byte)*puVar8;
        uVar9 = (uint)bVar4;
        uVar10 = (ulong)(uint)(bVar4 >> 4);
        if (bVar4 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= puVar20) goto LAB_0010a5d0;
          puVar15 = puVar8 + 1;
          uVar16 = 0;
          puVar8 = puVar8 + 8;
          do {
            puVar19 = puVar20;
            puVar12 = puVar8;
            puVar20 = (ushort *)((long)puVar19 + 1);
            uVar16 = uVar16 + *(byte *)((long)puVar12 + -0xf);
            puVar15 = (ushort *)((long)puVar15 + 1);
            puVar8 = (ushort *)((long)puVar12 + 1);
          } while (puVar12 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar12 + -0xf) == 0xff);
          uVar10 = (ulong)uVar16 + 0xf;
          pbVar18 = __dest + uVar10;
          if ((CARRY8((ulong)__dest,uVar10)) || ((ulong)-(long)puVar15 < uVar10)) {
            puVar20 = puVar12 + -7;
            goto LAB_0010a5d0;
          }
          if (dst + (long)dstCapacity + -0x20 < pbVar18) goto LAB_0010a40e;
          puVar8 = (ushort *)((ulong)uVar16 + (long)puVar12 + 1);
          if (puVar1 + -0x10 < puVar8) {
            puVar20 = puVar12 + -7;
            goto LAB_0010a40e;
          }
          lVar13 = 0;
          do {
            uVar6 = *(undefined8 *)((byte *)((long)puVar20 + lVar13) + 8);
            pbVar14 = __dest + lVar13;
            *(undefined8 *)pbVar14 = *(undefined8 *)((long)puVar20 + lVar13);
            *(undefined8 *)(pbVar14 + 8) = uVar6;
            pbVar3 = (byte *)((long)puVar19 + lVar13 + 0x11);
            uVar6 = *(undefined8 *)(pbVar3 + 8);
            *(undefined8 *)(pbVar14 + 0x10) = *(undefined8 *)pbVar3;
            *(undefined8 *)(pbVar14 + 0x18) = uVar6;
            lVar13 = lVar13 + 0x20;
          } while (pbVar14 + 0x20 < pbVar18);
        }
        else {
          pbVar18 = __dest + uVar10;
          if ((ushort *)((long)puVar1 - 0x11U) < puVar20) goto LAB_0010a40e;
          uVar6 = *(undefined8 *)((long)puVar8 + 9);
          *(undefined8 *)__dest = *(undefined8 *)puVar20;
          *(undefined8 *)(__dest + 8) = uVar6;
          puVar8 = (ushort *)(uVar10 + (long)puVar20);
        }
        uVar5 = *puVar8;
        uVar17 = (ulong)uVar5;
        puVar8 = puVar8 + 1;
        pbVar14 = pbVar18 + -uVar17;
        uVar21 = (ulong)(bVar4 & 0xf);
        if (uVar21 == 0xf) break;
        __dest = pbVar18 + uVar21 + 4;
        uVar21 = uVar21 + 4;
        if (pbVar2 + -0x40 <= __dest) goto LAB_0010a4f3;
        if ((pbVar14 < dst) || (uVar5 < 8)) goto LAB_0010a1aa;
        *(undefined8 *)pbVar18 = *(undefined8 *)pbVar14;
        *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar14 + 8);
        *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar14 + 0x10);
      }
      puVar20 = puVar8;
      if (pbVar14 < dst) goto LAB_0010a5d0;
      uVar9 = 0;
      puVar15 = puVar8;
      do {
        puVar8 = (ushort *)((long)puVar15 + 1);
        puVar20 = puVar8;
        if (puVar1 + -2 <= puVar8) goto LAB_0010a5d0;
        uVar7 = *puVar15;
        uVar9 = uVar9 + (byte)uVar7;
        puVar15 = puVar8;
      } while ((byte)uVar7 == 0xff);
      uVar10 = (ulong)uVar9;
      if ((byte *)(-0x10 - uVar10) < pbVar18) goto LAB_0010a5d0;
      uVar21 = uVar10 + 0x13;
      if (pbVar18 + uVar10 + 0x13 < pbVar2 + -0x40) {
LAB_0010a1aa:
        puVar20 = puVar8;
        if (pbVar14 < dst) goto LAB_0010a5d0;
        __dest = pbVar18 + uVar21;
        if (0xf < uVar5) {
          do {
            uVar6 = *(undefined8 *)(pbVar18 + -uVar17 + 8);
            *(undefined8 *)pbVar18 = *(undefined8 *)(pbVar18 + -uVar17);
            *(undefined8 *)(pbVar18 + 8) = uVar6;
            uVar6 = *(undefined8 *)(pbVar18 + -uVar17 + 0x10 + 8);
            *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)(pbVar18 + -uVar17 + 0x10);
            *(undefined8 *)(pbVar18 + 0x18) = uVar6;
            pbVar18 = pbVar18 + 0x20;
          } while (pbVar18 < __dest);
          goto LAB_0010a027;
        }
        if (uVar17 == 4) {
          iVar11 = *(int *)pbVar14;
        }
        else if (uVar5 == 2) {
          iVar11 = CONCAT22(*(undefined2 *)pbVar14,*(undefined2 *)pbVar14);
        }
        else {
          if (uVar5 != 1) {
            if (uVar5 < 8) {
              pbVar18[0] = 0;
              pbVar18[1] = 0;
              pbVar18[2] = 0;
              pbVar18[3] = 0;
              *pbVar18 = *pbVar14;
              pbVar18[1] = pbVar14[1];
              pbVar18[2] = pbVar14[2];
              pbVar18[3] = pbVar14[3];
              uVar9 = inc32table[uVar5];
              *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar14 + uVar9);
              pbVar14 = pbVar14 + ((ulong)uVar9 - (long)dec64table[uVar5]);
            }
            else {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar14;
              pbVar14 = pbVar14 + 8;
            }
            pbVar18 = pbVar18 + 8;
            do {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar14;
              pbVar18 = pbVar18 + 8;
              pbVar14 = pbVar14 + 8;
            } while (pbVar18 < __dest);
            goto LAB_0010a027;
          }
          iVar11 = (uint)*pbVar14 * 0x1010101;
        }
        *(int *)pbVar18 = iVar11;
        *(int *)(pbVar18 + 4) = iVar11;
        if (8 < uVar21) {
          pbVar18 = pbVar18 + 8;
          do {
            *(int *)pbVar18 = iVar11;
            *(int *)(pbVar18 + 4) = iVar11;
            pbVar18 = pbVar18 + 8;
          } while (pbVar18 < __dest);
        }
        goto LAB_0010a027;
      }
LAB_0010a4f3:
      do {
        puVar20 = puVar8;
        if (pbVar14 < dst) {
LAB_0010a5d0:
          local_38 = (int)src;
          return ~(uint)puVar20 + local_38;
        }
        __dest = pbVar18 + uVar21;
        if (pbVar2 + -0xc < __dest) {
          uVar10 = (long)pbVar2 - (long)pbVar18;
          if (uVar21 < (ulong)((long)pbVar2 - (long)pbVar18)) {
            uVar10 = uVar21;
          }
          __dest = pbVar18 + uVar10;
          if (pbVar18 < pbVar14 + uVar10) {
            if (pbVar2 != pbVar18) {
              do {
                bVar4 = *pbVar14;
                pbVar14 = pbVar14 + 1;
                *pbVar18 = bVar4;
                pbVar18 = pbVar18 + 1;
              } while (pbVar18 < __dest);
            }
          }
          else {
            memcpy(pbVar18,pbVar14,uVar10);
          }
          pbVar18 = pbVar2;
          if (__dest == pbVar2) goto LAB_0010a5f8;
        }
        else {
          if ((uint)uVar17 < 8) {
            pbVar18[0] = 0;
            pbVar18[1] = 0;
            pbVar18[2] = 0;
            pbVar18[3] = 0;
            *pbVar18 = *pbVar14;
            pbVar18[1] = pbVar14[1];
            pbVar18[2] = pbVar14[2];
            pbVar18[3] = pbVar14[3];
            uVar17 = (ulong)((uint)uVar17 << 2);
            uVar10 = (ulong)*(uint *)((long)inc32table + uVar17);
            *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar14 + uVar10);
            pbVar14 = pbVar14 + (uVar10 - (long)*(int *)((long)dec64table + uVar17));
          }
          else {
            *(undefined8 *)pbVar18 = *(undefined8 *)pbVar14;
            pbVar14 = pbVar14 + 8;
          }
          *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)pbVar14;
          if (0x10 < uVar21) {
            pbVar18 = pbVar18 + 0x10;
            do {
              pbVar14 = pbVar14 + 8;
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar14;
              pbVar18 = pbVar18 + 8;
            } while (pbVar18 < __dest);
          }
        }
LAB_0010a5aa:
        bVar4 = (byte)*puVar8;
        puVar20 = (ushort *)((long)puVar8 + 1);
        while( true ) {
          uVar9 = (uint)bVar4;
          if (bVar4 >> 4 == 0xf) break;
          uVar10 = (ulong)(uint)(bVar4 >> 4);
          if ((src + (long)compressedSize + -0x10 <= puVar20) ||
             (dst + (long)dstCapacity + -0x20 < __dest)) goto LAB_0010a40a;
          uVar6 = *(undefined8 *)(puVar20 + 4);
          *(undefined8 *)__dest = *(undefined8 *)puVar20;
          *(undefined8 *)(__dest + 8) = uVar6;
          pbVar18 = __dest + uVar10;
          uVar21 = (ulong)(uVar9 & 0xf);
          puVar8 = (ushort *)(uVar10 + 2 + (long)puVar20);
          uVar17 = (ulong)puVar8[-1];
          pbVar14 = pbVar18 + -uVar17;
          if ((((uVar9 & 0xf) == 0xf) || (puVar8[-1] < 8)) || (pbVar14 < dst)) goto LAB_0010a4af;
          *(undefined8 *)pbVar18 = *(undefined8 *)pbVar14;
          *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar14 + 8);
          *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar14 + 0x10);
          __dest = pbVar18 + uVar21 + 4;
          bVar4 = *(byte *)((long)puVar20 + uVar10 + 2);
          puVar20 = (ushort *)((long)puVar20 + uVar10 + 3);
        }
        if ((ushort *)((long)puVar1 - 0xfU) <= puVar20) goto LAB_0010a5d0;
        pbVar18 = (byte *)((long)puVar20 + 1);
        uVar16 = 0;
        do {
          uVar5 = *puVar20;
          puVar20 = (ushort *)((long)puVar20 + 1);
          uVar16 = uVar16 + (byte)uVar5;
          pbVar18 = pbVar18 + 1;
        } while (puVar20 < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar5 == 0xff);
        uVar10 = (ulong)uVar16 + 0xf;
        if ((CARRY8((ulong)__dest,uVar10)) || ((ulong)-(long)pbVar18 < uVar10)) goto LAB_0010a5d0;
LAB_0010a40a:
        pbVar18 = __dest + uVar10;
LAB_0010a40e:
        puVar8 = (ushort *)((long)puVar20 + uVar10);
        if ((pbVar2 + -0xc < pbVar18) || (puVar1 + -4 < puVar8)) {
          pbVar14 = pbVar18;
          if (puVar1 < puVar8) {
            pbVar14 = __dest + ((long)puVar1 - (long)puVar20);
          }
          if (pbVar2 < pbVar14) {
            memmove(__dest,puVar20,(long)pbVar2 - (long)__dest);
            pbVar18 = pbVar2;
LAB_0010a5f8:
            return (int)pbVar18 - (int)dst;
          }
          if (puVar1 < puVar8) {
            uVar10 = (long)puVar1 - (long)puVar20;
          }
          memmove(__dest,puVar20,uVar10);
          pbVar18 = __dest + uVar10;
          if ((pbVar14 == pbVar2) ||
             (puVar8 = (ushort *)((long)puVar20 + uVar10), puVar1 + -1 <= puVar8))
          goto LAB_0010a5f8;
        }
        else {
          do {
            *(undefined8 *)__dest = *(undefined8 *)puVar20;
            __dest = __dest + 8;
            puVar20 = puVar20 + 4;
          } while (__dest < pbVar18);
        }
        uVar17 = (ulong)*puVar8;
        puVar8 = puVar8 + 1;
        pbVar14 = pbVar18 + -uVar17;
        uVar21 = (ulong)(uVar9 & 0xf);
LAB_0010a4af:
        if ((int)uVar21 == 0xf) {
          uVar9 = 0;
          do {
            puVar20 = puVar8;
            puVar8 = (ushort *)((long)puVar20 + 1);
            if (puVar1 + -2 <= puVar8) goto LAB_0010a5cd;
            uVar9 = uVar9 + (byte)*puVar20;
          } while ((byte)*puVar20 == 0xff);
          uVar21 = (ulong)uVar9 + 0xf;
          if (CARRY8((ulong)pbVar18,uVar21)) {
LAB_0010a5cd:
            puVar20 = (ushort *)((long)puVar20 + 1);
            goto LAB_0010a5d0;
          }
        }
        uVar21 = uVar21 + 4;
      } while( true );
    }
  }
  return iVar11;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  endOnInputSize, partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}